

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

void __thiscall
google::protobuf::TextFormat::FastFieldValuePrinter::PrintFloat
          (FastFieldValuePrinter *this,float val,BaseTextGenerator *generator)

{
  string local_38;
  float local_18;
  allocator local_11;
  
  local_18 = val;
  if (NAN(val)) {
    std::__cxx11::string::string((string *)&local_38,"nan",&local_11);
  }
  else {
    SimpleFtoa_abi_cxx11_(&local_38,(protobuf *)generator,val);
  }
  (*generator->_vptr_BaseTextGenerator[5])
            (generator,local_38._M_dataplus._M_p,local_38._M_string_length);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void TextFormat::FastFieldValuePrinter::PrintFloat(
    float val, BaseTextGenerator* generator) const {
  generator->PrintString(!std::isnan(val) ? SimpleFtoa(val) : "nan");
}